

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O3

CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
          (CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *other)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  
  plVar2 = *(long **)this;
  lVar6 = *(long *)(this + 0x10);
  lVar3 = plVar2[2];
  if (lVar6 == lVar3) {
    lVar6 = *(long *)(this + 8);
    lVar4 = *(long *)(this + 0x18);
    *(long *)(this + 8) = lVar6 + lVar4;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 1;
    if (plVar2[1] <= lVar6 + lVar4) {
      __assert_fail("m_row+m_currentBlockRows<=m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x5d,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 1>>]"
                   );
    }
    lVar6 = 0;
  }
  if (lVar3 < lVar6 + 3) {
    __assert_fail("(m_col + other.cols() <= m_xpr.cols()) && \"Too many coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x60,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 1>>]"
                 );
  }
  if (*(long *)(this + 0x18) != 1) {
    __assert_fail("m_currentBlockRows==other.rows()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x61,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 1>>]"
                 );
  }
  lVar3 = *(long *)(this + 8);
  if (((-1 < lVar3) && (-1 < lVar6)) && (lVar4 = plVar2[1], lVar3 < lVar4)) {
    lVar3 = *plVar2 + lVar3 * 8;
    lVar1 = lVar3 + lVar6 * lVar4 * 8;
    puVar5 = *(undefined8 **)other;
    *(undefined8 *)(lVar3 + lVar6 * lVar4 * 8) = *puVar5;
    *(undefined8 *)(lVar1 + lVar4 * 8) = puVar5[1];
    *(undefined8 *)(lVar4 * 0x10 + lVar1) = puVar5[2];
    *(long *)(this + 0x10) = lVar6 + 3;
    return (CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1, 3>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const DenseBase<OtherDerived>& other)
  {
    if (m_col==m_xpr.cols() && (other.cols()!=0 || other.rows()!=m_currentBlockRows))
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = other.rows();
      eigen_assert(m_row+m_currentBlockRows<=m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert((m_col + other.cols() <= m_xpr.cols())
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==other.rows());
    m_xpr.template block<OtherDerived::RowsAtCompileTime, OtherDerived::ColsAtCompileTime>
                    (m_row, m_col, other.rows(), other.cols()) = other;
    m_col += other.cols();
    return *this;
  }